

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O0

BtorSimBitVector * btorsim_bv_sll(BtorSimBitVector *a,BtorSimBitVector *b)

{
  uint32_t uVar1;
  BtorSimBitVector *pBVar2;
  BtorSimBitVector *in_RSI;
  BtorSimBitVector *in_RDI;
  BtorSimBitVector *lower;
  BtorSimBitVector *res;
  uint64_t shift;
  BtorSimBitVector *in_stack_ffffffffffffffd0;
  BtorSimBitVector *in_stack_fffffffffffffff8;
  
  if (in_RSI->width < 0x41) {
    btorsim_bv_to_uint64(in_RSI);
    uVar1 = (uint32_t)((ulong)in_RDI >> 0x20);
  }
  else {
    uVar1 = btorsim_bv_get_num_leading_zeros(in_stack_ffffffffffffffd0);
    if (uVar1 < in_RSI->width - 0x40) {
      pBVar2 = btorsim_bv_new((uint32_t)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
      return pBVar2;
    }
    pBVar2 = btorsim_bv_slice(in_RDI,(uint32_t)((ulong)in_RSI >> 0x20),(uint32_t)in_RSI);
    uVar1 = (uint32_t)((ulong)in_RDI >> 0x20);
    btorsim_bv_to_uint64(pBVar2);
    btorsim_bv_free((BtorSimBitVector *)0x13a5f3);
  }
  pBVar2 = sll_bv(in_stack_fffffffffffffff8,uVar1);
  return pBVar2;
}

Assistant:

BtorSimBitVector *
btorsim_bv_sll (const BtorSimBitVector *a, const BtorSimBitVector *b)
{
  assert (a);
  assert (b);
  assert (a->len == b->len);
  assert (a->width == b->width);

  uint64_t shift;
  BtorSimBitVector *res;
  if (b->width <= 64)
    shift = btorsim_bv_to_uint64 (b);
  else
  {
    if (btorsim_bv_get_num_leading_zeros (b) < (b->width - 64))
      return btorsim_bv_new (a->width);
    BtorSimBitVector *lower = btorsim_bv_slice (b, 63, 0);
    shift                   = btorsim_bv_to_uint64 (lower);
    btorsim_bv_free (lower);
  }
  res = sll_bv (a, shift);
  return res;
}